

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

void glfwGetMonitorPos(GLFWmonitor *handle,int *xpos,int *ypos)

{
  _GLFWmonitor *monitor;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("monitor != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/glfw/src/monitor.c"
                  ,0x147,"void glfwGetMonitorPos(GLFWmonitor *, int *, int *)");
  }
  if (xpos != (int *)0x0) {
    *xpos = 0;
  }
  if (ypos != (int *)0x0) {
    *ypos = 0;
  }
  if (_glfw.initialized != 0) {
    _glfwPlatformGetMonitorPos((_GLFWmonitor *)handle,xpos,ypos);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorPos(GLFWmonitor* handle, int* xpos, int* ypos)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();

    _glfwPlatformGetMonitorPos(monitor, xpos, ypos);
}